

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O0

void __thiscall
alex::ExpectedShiftsAccumulator::accumulate
          (ExpectedShiftsAccumulator *this,int actual_position,int param_2)

{
  long lVar1;
  longlong dense_region_length;
  int param_2_local;
  int actual_position_local;
  ExpectedShiftsAccumulator *this_local;
  
  if (this->last_position_ + 1 < actual_position) {
    lVar1 = (long)((this->last_position_ - this->dense_region_start_idx_) + 1);
    this->num_expected_shifts_ = (lVar1 * lVar1) / 4 + this->num_expected_shifts_;
    this->dense_region_start_idx_ = actual_position;
  }
  this->last_position_ = actual_position;
  this->count_ = this->count_ + 1;
  return;
}

Assistant:

void accumulate(int actual_position, int) override {
    if (actual_position > last_position_ + 1) {
      long long dense_region_length = last_position_ - dense_region_start_idx_ + 1;
      num_expected_shifts_ += (dense_region_length * dense_region_length) / 4;
      dense_region_start_idx_ = actual_position;
    }
    last_position_ = actual_position;
    count_++;
  }